

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void __thiscall
Assimp::PlyExporter::WriteMeshVertsBinary(PlyExporter *this,aiMesh *m,uint components)

{
  bool bVar1;
  uint local_54;
  uint local_50;
  uint c_1;
  uint n_1;
  uint c;
  uint n;
  uint i;
  aiColor4D defaultColor;
  aiVector2D defaultUV;
  aiVector3D defaultNormal;
  uint components_local;
  aiMesh *m_local;
  PlyExporter *this_local;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&defaultUV,0.0,0.0,0.0);
  aiVector2t<float>::aiVector2t((aiVector2t<float> *)&defaultColor.b,-1.0,-1.0);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)&n,-1.0,-1.0,-1.0,-1.0);
  for (c = 0; c < m->mNumVertices; c = c + 1) {
    std::ostream::write((char *)this,(long)(m->mVertices + c));
    if ((components & 1) != 0) {
      bVar1 = aiMesh::HasNormals(m);
      if (bVar1) {
        std::ostream::write((char *)this,(long)(m->mNormals + c));
      }
      else {
        std::ostream::write((char *)this,(long)&defaultUV);
      }
    }
    c_1 = 0;
    for (n_1 = 4; (components & n_1) != 0 && c_1 != 8; n_1 = n_1 << 1) {
      bVar1 = aiMesh::HasTextureCoords(m,c_1);
      if (bVar1) {
        std::ostream::write((char *)this,(long)(m->mTextureCoords[c_1] + c));
      }
      else {
        std::ostream::write((char *)this,(long)&defaultColor.b);
      }
      c_1 = c_1 + 1;
    }
    local_54 = 0;
    for (local_50 = 0x400; (components & local_50) != 0 && local_54 != 8; local_50 = local_50 << 1)
    {
      bVar1 = aiMesh::HasVertexColors(m,local_54);
      if (bVar1) {
        std::ostream::write((char *)this,(long)(m->mColors[local_54] + c));
      }
      else {
        std::ostream::write((char *)this,(long)&n);
      }
      local_54 = local_54 + 1;
    }
    if ((components & 2) != 0) {
      bVar1 = aiMesh::HasTangentsAndBitangents(m);
      if (bVar1) {
        std::ostream::write((char *)this,(long)(m->mTangents + c));
        std::ostream::write((char *)this,(long)(m->mBitangents + c));
      }
      else {
        std::ostream::write((char *)this,(long)&defaultUV);
        std::ostream::write((char *)this,(long)&defaultUV);
      }
    }
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshVertsBinary(const aiMesh* m, unsigned int components)
{
    // If a component (for instance normal vectors) is present in at least one mesh in the scene,
    // then default values are written for meshes that do not contain this component.
    aiVector3D defaultNormal(0, 0, 0);
    aiVector2D defaultUV(-1, -1);
    aiColor4D defaultColor(-1, -1, -1, -1);
    for (unsigned int i = 0; i < m->mNumVertices; ++i) {
        mOutput.write(reinterpret_cast<const char*>(&m->mVertices[i].x), 12);
        if (components & PLY_EXPORT_HAS_NORMALS) {
            if (m->HasNormals()) {
                mOutput.write(reinterpret_cast<const char*>(&m->mNormals[i].x), 12);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultNormal.x), 12);
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
            if (m->HasTextureCoords(c)) {
                mOutput.write(reinterpret_cast<const char*>(&m->mTextureCoords[c][i].x), 8);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultUV.x), 8);
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
            if (m->HasVertexColors(c)) {
                mOutput.write(reinterpret_cast<const char*>(&m->mColors[c][i].r), 16);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultColor.r), 16);
            }
        }

        if (components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
            if (m->HasTangentsAndBitangents()) {
                mOutput.write(reinterpret_cast<const char*>(&m->mTangents[i].x), 12);
                mOutput.write(reinterpret_cast<const char*>(&m->mBitangents[i].x), 12);
            }
            else {
                mOutput.write(reinterpret_cast<const char*>(&defaultNormal.x), 12);
                mOutput.write(reinterpret_cast<const char*>(&defaultNormal.x), 12);
            }
        }
    }
}